

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_eliminate_unused_globals(REF_NODE ref_node)

{
  REF_MPI ref_mpi;
  REF_INT *pRVar1;
  REF_GLOB *pRVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  void *array;
  REF_INT *counts;
  long lVar7;
  REF_GLOB *pRVar8;
  long lVar9;
  undefined8 uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  char *pcVar14;
  size_t __size;
  
  ref_mpi = ref_node->ref_mpi;
  uVar4 = ref_sort_in_place_glob(ref_node->n_unused,ref_node->unused_global);
  if (uVar4 == 0) {
    if ((long)ref_mpi->n < 0) {
      pcVar14 = "malloc counts of REF_INT negative";
      uVar10 = 0x27f;
LAB_00175d7b:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar10
             ,"ref_node_eliminate_unused_globals",pcVar14);
      uVar4 = 1;
    }
    else {
      __size = (long)ref_mpi->n << 2;
      array = malloc(__size);
      if (array == (void *)0x0) {
        pcVar14 = "malloc counts of REF_INT NULL";
        uVar10 = 0x27f;
      }
      else {
        counts = (REF_INT *)malloc(__size);
        if (counts != (REF_INT *)0x0) {
          uVar4 = ref_mpi_allgather(ref_mpi,&ref_node->n_unused,array,1);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x283,"ref_node_eliminate_unused_globals",(ulong)uVar4,"gather size");
            return uVar4;
          }
          lVar9 = (long)ref_mpi->n;
          if (lVar9 < 1) {
            lVar7 = 0;
          }
          else {
            lVar13 = 0;
            lVar7 = 0;
            do {
              lVar7 = lVar7 + *(int *)((long)array + lVar13 * 4);
              lVar13 = lVar13 + 1;
            } while (lVar9 != lVar13);
          }
          iVar5 = (int)(lVar7 / lVar9) + 1;
          iVar12 = 100000;
          if (100000 < iVar5) {
            iVar12 = iVar5;
          }
          uVar4 = ref_mpi->n;
          if (0 < (int)uVar4) {
            uVar11 = 0;
            do {
              uVar3 = (uint)uVar11;
              uVar11 = (ulong)(uVar3 + 1);
              if ((int)(uVar3 + 1) < (int)uVar4) {
                iVar5 = *(int *)((long)array + (long)(int)uVar3 * 4);
                uVar11 = (long)(int)uVar3 + 1;
                do {
                  iVar5 = iVar5 + *(int *)((long)array + uVar11 * 4);
                  if (iVar12 < iVar5) goto LAB_00175e3f;
                  uVar11 = uVar11 + 1;
                } while ((long)(int)uVar4 != uVar11);
                uVar11 = (ulong)uVar4;
              }
LAB_00175e3f:
              if (0 < ref_mpi->n) {
                lVar9 = 0;
                do {
                  counts[lVar9] = 0;
                  lVar9 = lVar9 + 1;
                } while (lVar9 < ref_mpi->n);
              }
              iVar5 = (int)uVar11;
              if ((int)uVar3 < iVar5) {
                memcpy(counts + (int)uVar3,(void *)((long)array + (long)(int)uVar3 * 4),
                       (ulong)(~uVar3 + iVar5) * 4 + 4);
              }
              uVar4 = 0;
              if ((int)uVar3 < iVar5) {
                lVar9 = (long)(int)uVar3;
                uVar4 = 0;
                do {
                  uVar4 = uVar4 + counts[lVar9];
                  lVar9 = lVar9 + 1;
                } while (iVar5 != lVar9);
              }
              if ((int)uVar4 < 0) {
                pcVar14 = "malloc unused of REF_GLOB negative";
                uVar10 = 0x2a0;
                goto LAB_00175d7b;
              }
              pRVar8 = (REF_GLOB *)malloc((ulong)uVar4 << 3);
              if (pRVar8 == (REF_GLOB *)0x0) {
                pcVar14 = "malloc unused of REF_GLOB NULL";
                uVar10 = 0x2a0;
                goto LAB_00175dd0;
              }
              uVar6 = ref_mpi_allgatherv(ref_mpi,ref_node->unused_global,counts,pRVar8,2);
              if (uVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x2a3,"ref_node_eliminate_unused_globals",(ulong)uVar6,
                       "gather active unused");
                return uVar6;
              }
              uVar6 = ref_sort_in_place_glob(uVar4,pRVar8);
              if (uVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x2a5,"ref_node_eliminate_unused_globals",(ulong)uVar6,"in place sort");
                return uVar6;
              }
              if (ref_mpi->id < iVar5 && (int)uVar3 <= ref_mpi->id) {
                ref_node->n_unused = 0;
              }
              ref_node_eliminate_unused_offset(ref_node->n,ref_node->sorted_global,uVar4,pRVar8);
              ref_node_eliminate_unused_offset
                        (ref_node->n_unused,ref_node->unused_global,uVar4,pRVar8);
              free(pRVar8);
              uVar4 = ref_mpi->n;
              uVar11 = uVar11 & 0xffffffff;
            } while (iVar5 < (int)uVar4);
          }
          iVar12 = ref_node->n;
          if (0 < (long)iVar12) {
            pRVar1 = ref_node->sorted_local;
            pRVar8 = ref_node->global;
            pRVar2 = ref_node->sorted_global;
            lVar9 = 0;
            do {
              pRVar8[pRVar1[lVar9]] = pRVar2[lVar9];
              lVar9 = lVar9 + 1;
            } while (iVar12 != lVar9);
          }
          lVar7 = ref_node->old_n_global - lVar7;
          ref_node->old_n_global = lVar7;
          ref_node->new_n_global = lVar7;
          free(counts);
          free(array);
          return 0;
        }
        pcVar14 = "malloc active_counts of REF_INT NULL";
        uVar10 = 0x280;
      }
LAB_00175dd0:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar10
             ,"ref_node_eliminate_unused_globals",pcVar14);
      uVar4 = 2;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x27c,
           "ref_node_eliminate_unused_globals",(ulong)uVar4,"in place");
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_node_eliminate_unused_globals(REF_NODE ref_node) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT *counts, *active_counts;
  REF_GLOB *unused;
  REF_GLOB total_unused;
  REF_INT total_active;
  REF_INT part, chunk;
  REF_INT active0, active1, nactive;
  REF_INT i, local;

  /* sort so that decrement of future processed unused works */
  RSS(ref_sort_in_place_glob(ref_node_n_unused(ref_node),
                             ref_node->unused_global),
      "in place");

  /* share unused count */
  ref_malloc(counts, ref_mpi_n(ref_mpi), REF_INT);
  ref_malloc(active_counts, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &(ref_node_n_unused(ref_node)), counts,
                        REF_INT_TYPE),
      "gather size");
  total_unused = 0;
  each_ref_mpi_part(ref_mpi, part) total_unused += counts[part];

  /* heuristic of max to process at a time */
  chunk = (REF_INT)(total_unused / ref_mpi_n(ref_mpi) + 1);
  chunk = MAX(chunk, 100000);

  /* while have unused to process */
  active0 = 0;
  while (active0 < ref_mpi_n(ref_mpi)) {
    /* processor [active0, active1) slice of at least one and less than chunk */
    RSS(ref_node_eliminate_active_parts(ref_mpi_n(ref_mpi), counts, chunk,
                                        active0, &active1, &nactive),
        "active part range");

    /* active unused count and share active unused list, sorted */
    each_ref_mpi_part(ref_mpi, part) active_counts[part] = 0;
    for (part = active0; part < active1; part++) {
      active_counts[part] = counts[part];
    }

    /* count active unused (between active0 and active1-1) */
    total_active = 0;
    for (part = active0; part < active1; part++) {
      total_active += active_counts[part];
    }

    /* gather active unused, and sort */
    ref_malloc(unused, total_active, REF_GLOB);
    RSS(ref_mpi_allgatherv(ref_mpi, ref_node->unused_global, active_counts,
                           unused, REF_GLOB_TYPE),
        "gather active unused");
    /* (each part already sorted, merge sort faster? */
    RSS(ref_sort_in_place_glob(total_active, unused), "in place sort");

    /* erase unused gathered in active unused list */
    if (active0 <= ref_mpi_rank(ref_mpi) && ref_mpi_rank(ref_mpi) < active1)
      ref_node_n_unused(ref_node) = 0;

    /* shift ref_node sorted_globals */
    RSS(ref_node_eliminate_unused_offset(ref_node_n(ref_node),
                                         ref_node->sorted_global, total_active,
                                         unused),
        "offset sorted globals");

    /* shift unprocessed unused */
    RSS(ref_node_eliminate_unused_offset(ref_node_n_unused(ref_node),
                                         ref_node->unused_global, total_active,
                                         unused),
        "offset sorted unused");
    ref_free(unused);

    active0 = active1;
  }

  /* update node global with shifted sorted_global */
  for (i = 0; i < ref_node_n(ref_node); i++) {
    local = ref_node->sorted_local[i];
    ref_node->global[local] = ref_node->sorted_global[i];
  }

  /* set compact global count */
  RSS(ref_node_initialize_n_global(ref_node,
                                   ref_node->old_n_global - total_unused),
      "re-init");

  ref_free(active_counts);
  ref_free(counts);
  return REF_SUCCESS;
}